

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O3

void __thiscall
onmt::Tokenizer::tokenize_on_placeholders
          (Tokenizer *this,string *text,vector<onmt::Token,_std::allocator<onmt::Token>_> *tokens)

{
  CharInfo *character;
  pointer pTVar1;
  pointer pCVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  bool *pbVar6;
  long lVar7;
  bool bVar8;
  ulong uVar9;
  vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_> chars;
  TokensBuilder builder;
  vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_> local_d0;
  string *local_b8;
  TokensBuilder local_b0;
  
  unicode::get_characters_info(&local_d0,text);
  local_b0._current_token.surface._M_dataplus._M_p =
       (pointer)&local_b0._current_token.surface.field_2;
  local_b0._no_substitution = (this->_options).no_substitution;
  local_b0._current_token.surface._M_string_length = 0;
  local_b0._current_token.surface.field_2._M_local_buf[0] = '\0';
  local_b0._current_token.type = Word;
  local_b0._current_token.casing = None;
  local_b0._current_token.join_left = false;
  local_b0._current_token.join_right = false;
  local_b0._current_token.spacer = false;
  local_b0._current_token.preserve = false;
  local_b0._current_feature._M_dataplus._M_p = (pointer)&local_b0._current_feature.field_2;
  local_b0._current_token.features.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b0._current_token.features.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b0._current_token.features.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b0._current_length = 0;
  local_b0._current_feature._M_string_length = 0;
  local_b0._current_feature.field_2._M_local_buf[0] = '\0';
  local_b0._tokens = tokens;
  if (local_d0.super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_d0.super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_b8 = &(this->_options).joiner;
    lVar7 = 0;
    bVar8 = false;
    bVar3 = false;
    uVar9 = 0;
    do {
      pCVar2 = local_d0.
               super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      character = (CharInfo *)
                  ((long)&(local_d0.
                           super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                           ._M_impl.super__Vector_impl_data._M_start)->data + lVar7);
      iVar5 = *(int *)((long)&(local_d0.
                               super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                               ._M_impl.super__Vector_impl_data._M_start)->value + lVar7);
      if (bVar8) {
        if (*(int *)((long)&(local_d0.
                             super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                             ._M_impl.super__Vector_impl_data._M_start)->char_type + lVar7) == 4) {
          bVar8 = true;
          TokensBuilder::escape_append(&local_b0,character);
        }
        else {
          std::__cxx11::string::append
                    ((char *)&local_b0._current_token,
                     *(ulong *)((long)&(local_d0.
                                        super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->data + lVar7));
          local_b0._current_length = local_b0._current_length + 1;
          bVar8 = true;
          if (iVar5 == 0xff60) {
            if ((uVar9 + 1 <
                 (ulong)((long)local_d0.
                               super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_d0.
                               super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5)) &&
               (*(int *)((long)&local_d0.
                                super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                                ._M_impl.super__Vector_impl_data._M_start[1].char_type + lVar7) != 4
               )) {
              local_b0._current_token.join_right = true;
            }
            pbVar6 = &local_b0._current_token.preserve;
            if (((this->_options).preserve_placeholders != false) ||
               (pbVar6 = &local_b0._current_token.preserve,
               (this->_options).preserve_segmented_tokens == true)) goto LAB_001b43dd;
LAB_001b43e0:
            TokensBuilder::segment(&local_b0);
            goto LAB_001b445e;
          }
        }
      }
      else {
        if (((this->_options).support_prior_joiners == true) &&
           (iVar4 = std::__cxx11::string::compare
                              ((ulong)local_b8,0,(char *)(this->_options).joiner._M_string_length,
                               *(ulong *)((long)&(local_d0.
                                                  super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->data +
                                         lVar7)), iVar4 == 0)) {
          pbVar6 = &local_b0._current_token.join_right;
          if (local_b0._current_token.surface._M_string_length != 0) {
LAB_001b43dd:
            *pbVar6 = true;
            goto LAB_001b43e0;
          }
          if ((uVar9 == 0) ||
             (*(int *)((long)local_d0.
                             super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar7 + -0xc) != 4)) {
            pTVar1 = ((local_b0._tokens)->
                     super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            if (pTVar1 != ((local_b0._tokens)->
                          super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
                          super__Vector_impl_data._M_start) {
              pTVar1[-1].join_right = true;
            }
          }
          else {
            local_b0._current_token.join_left = true;
          }
        }
        else {
          if (iVar5 == 0xff5f) {
            if (local_b0._current_token.surface._M_string_length != 0) {
              if ((uVar9 != 0) &&
                 (*(int *)((long)local_d0.
                                 super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar7 + -0xc) != 4)) {
                local_b0._current_token.join_right = true;
              }
              if ((this->_options).preserve_segmented_tokens == true) {
                local_b0._current_token.preserve = true;
              }
              TokensBuilder::segment(&local_b0);
            }
            std::__cxx11::string::append
                      ((char *)&local_b0._current_token,*(ulong *)((long)&pCVar2->data + lVar7));
            local_b0._current_length = local_b0._current_length + 1;
            bVar8 = true;
            goto LAB_001b4461;
          }
          if ((this->_options).mode == Space) {
            iVar5 = std::__cxx11::string::compare
                              ((ulong)&ITokenizer::feature_marker_abi_cxx11_,0,DAT_00383518,
                               *(ulong *)((long)&pCVar2->data + lVar7));
            if (iVar5 == 0) {
              TokensBuilder::flush_feature(&local_b0);
LAB_001b442d:
              bVar3 = true;
            }
            else {
              if (*(int *)((long)&pCVar2->char_type + lVar7) == 4) {
                TokensBuilder::flush_feature(&local_b0);
                TokensBuilder::segment(&local_b0);
              }
              else {
                if (bVar3) {
                  std::__cxx11::string::append
                            ((char *)&local_b0._current_feature,
                             *(ulong *)((long)&pCVar2->data + lVar7));
                  goto LAB_001b442d;
                }
                TokensBuilder::safe_append(&local_b0,character);
              }
              bVar3 = false;
            }
          }
          else {
            TokensBuilder::safe_append(&local_b0,character);
          }
        }
LAB_001b445e:
        bVar8 = false;
      }
LAB_001b4461:
      uVar9 = uVar9 + 1;
      lVar7 = lVar7 + 0x20;
    } while (uVar9 < (ulong)((long)local_d0.
                                   super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_d0.
                                   super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  TokensBuilder::~TokensBuilder(&local_b0);
  if (local_d0.super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.
                    super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d0.
                          super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.
                          super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Tokenizer::tokenize_on_placeholders(const std::string& text,
                                           std::vector<Token>& tokens) const
  {
    // Split on characters.
    const auto chars = unicode::get_characters_info(text);

    TokensBuilder builder(_options, tokens);
    bool in_placeholder = false;
    bool in_features = false;

    for (size_t i = 0; i < chars.size(); ++i)
    {
      auto& token = builder.current();
      const auto& c = chars[i];
      const auto v = c.value;

      if (!in_placeholder)
      {
        if (_options.support_prior_joiners && c == _options.joiner)
        {
          // Mark joint but discard character.
          if (token.empty())
          {
            if (i > 0 && chars[i - 1].char_type == unicode::CharType::Separator)
              token.join_left = true;
            else if (builder.num_tokens() > 0)
              builder.previous().join_right = true;
          }
          else
          {
            token.join_right = true;
            builder.segment();
          }
        }
        else if (v == ph_marker_open_cp)
        {
          if (!token.empty())
          {
            // Flush accumulated token and mark joint if it did not finish by a separator.
            if (i > 0 && chars[i - 1].char_type != unicode::CharType::Separator)
              token.join_right = true;
            if (_options.preserve_segmented_tokens)
              token.preserve = true;
            builder.segment();
          }

          builder.append(c);
          in_placeholder = true;
        }
        else if (_options.mode == Mode::Space)
        {
          if (c == ITokenizer::feature_marker)
          {
            builder.flush_feature();
            in_features = true;
          }
          else if (c.char_type == unicode::CharType::Separator)
          {
            builder.flush_feature();
            builder.segment();
            in_features = false;
          }
          else if (in_features)
          {
            builder.append_to_feature(c);
          }
          else
          {
            builder.safe_append(c);
          }
        }
        else
        {
          // Normalize character for consistency with other tokenization modes.
          builder.safe_append(c);
        }
      }

      // In a placeholder.
      else if (c.char_type == unicode::CharType::Separator)
        builder.escape_append(c);
      else
      {
        builder.append(c);  // Do not normalize character inside placeholders.
        if (v == ph_marker_close_cp)
        {
          // Flush accumulated placeholder and mark joint if the next character is not a separator.
          // No need to check for emptiness as in_placeholder == true means at least the opening
          // character was accumulated.
          if (i + 1 < chars.size() && chars[i + 1].char_type != unicode::CharType::Separator)
            token.join_right = true;
          if (_options.preserve_placeholders || _options.preserve_segmented_tokens)
            token.preserve = true;
          builder.segment();
          in_placeholder = false;
        }
      }
    }
  }